

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesNode.cpp
# Opt level: O3

ChVariablesNode * __thiscall
chrono::ChVariablesNode::operator=(ChVariablesNode *this,ChVariablesNode *other)

{
  if (other != this) {
    ChVariables::operator=(&this->super_ChVariables,&other->super_ChVariables);
    this->user_data = other->user_data;
    this->mass = other->mass;
  }
  return this;
}

Assistant:

ChVariablesNode& ChVariablesNode::operator=(const ChVariablesNode& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariables::operator=(other);

    // copy class data
    user_data = other.user_data;
    mass = other.mass;

    return *this;
}